

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool tinyusdz::anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
               (Stage *stage,Prim *prim,Path *parentPath,uint32_t depth,bool assign_prim_id,
               bool force_assign_prim_id,string *err)

{
  uint64_t uVar1;
  bool bVar2;
  ulong uVar3;
  string *elem;
  Path *pPVar4;
  int64_t *piVar5;
  uint64_t *puVar6;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  reference prim_00;
  Prim *child;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  uint64_t local_168;
  uint64_t prim_id;
  Path abs_path;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [34];
  byte local_2e;
  byte local_2d;
  uint32_t local_2c;
  bool force_assign_prim_id_local;
  bool assign_prim_id_local;
  Path *pPStack_28;
  uint32_t depth_local;
  Path *parentPath_local;
  Prim *prim_local;
  Stage *stage_local;
  
  local_2e = force_assign_prim_id;
  local_2d = assign_prim_id;
  local_2c = depth;
  pPStack_28 = parentPath;
  parentPath_local = &prim->_abs_path;
  prim_local = (Prim *)stage;
  if (0x8000000 < depth) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Prim hierarchy too deep.\n");
    }
    stage_local._7_1_ = 0;
    goto LAB_0046abaf;
  }
  Prim::element_name_abi_cxx11_(prim);
  uVar3 = ::std::__cxx11::string::empty();
  pPVar4 = pPStack_28;
  if ((uVar3 & 1) != 0) {
    if (err != (string *)0x0) {
      Path::full_path_name_abi_cxx11_((string *)&abs_path._valid,pPStack_28);
      ::std::operator+((char *)local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Prim\'s elementName is empty. Prim\'s parent Path = ");
      ::std::operator+(local_50,(char *)local_70);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__cxx11::string::~string(local_70);
      ::std::__cxx11::string::~string((string *)&abs_path._valid);
    }
    stage_local._7_1_ = 0;
    goto LAB_0046abaf;
  }
  elem = Prim::element_name_abi_cxx11_((Prim *)parentPath_local);
  Path::AppendPrim((Path *)&prim_id,pPVar4,elem);
  pPVar4 = Prim::absolute_path((Prim *)parentPath_local);
  Path::operator=(pPVar4,(Path *)&prim_id);
  if (((local_2d & 1) == 0) ||
     (((local_2e & 1) == 0 && (piVar5 = Prim::prim_id((Prim *)parentPath_local), 0 < *piVar5)))) {
LAB_0046aacf:
    this = Prim::children((Prim *)parentPath_local);
    __end2._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this);
    child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&child), bVar2) {
      prim_00 = __gnu_cxx::
                __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                ::operator*(&__end2);
      bVar2 = ComputeAbsPathAndAssignPrimIdRec
                        ((Stage *)prim_local,prim_00,(Path *)&prim_id,local_2c + 1,
                         (bool)(local_2d & 1),(bool)(local_2e & 1),err);
      if (!bVar2) {
        stage_local._7_1_ = 0;
        goto LAB_0046aba3;
      }
      __gnu_cxx::
      __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
    stage_local._7_1_ = 1;
  }
  else {
    local_168 = 0;
    bVar2 = Stage::allocate_prim_id((Stage *)prim_local,&local_168);
    uVar1 = local_168;
    if (bVar2) {
      puVar6 = (uint64_t *)Prim::prim_id((Prim *)parentPath_local);
      *puVar6 = uVar1;
      goto LAB_0046aacf;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Failed to assign unique Prim ID.\n");
    }
    stage_local._7_1_ = 0;
  }
LAB_0046aba3:
  Path::~Path((Path *)&prim_id);
LAB_0046abaf:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool ComputeAbsPathAndAssignPrimIdRec(const Stage &stage, Prim &prim,
                                      const Path &parentPath, uint32_t depth,
                                      bool assign_prim_id,
                                      bool force_assign_prim_id = true,
                                      std::string *err = nullptr) {
  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    if (err) {
      (*err) += "Prim hierarchy too deep.\n";
    }
    return false;
  }

  if (prim.element_name().empty()) {
    // Prim's elementName must not be empty.
    if (err) {
      (*err) += "Prim's elementName is empty. Prim's parent Path = " +
                parentPath.full_path_name() + "\n";
    }
    return false;
  }

  Path abs_path = parentPath.AppendPrim(prim.element_name());

  prim.absolute_path() = abs_path;
  if (assign_prim_id) {
    if (force_assign_prim_id || (prim.prim_id() < 1)) {
      uint64_t prim_id{0};
      if (!stage.allocate_prim_id(&prim_id)) {
        if (err) {
          (*err) += "Failed to assign unique Prim ID.\n";
        }
        return false;
      }
      prim.prim_id() = int64_t(prim_id);
    }
  }

  for (Prim &child : prim.children()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(stage, child, abs_path, depth + 1,
                                          assign_prim_id, force_assign_prim_id,
                                          err)) {
      return false;
    }
  }

  return true;
}